

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

void err_print(Err *err,_Bool use_color)

{
  if (err != (Err *)0x0) {
    printf("error: %s\n",err->desc);
    return;
  }
  return;
}

Assistant:

void err_print(Err *err, bool use_color) {
	if (err == NULL) {
		return;
	}
	if (use_color) {
		err_print_color(err);
	} else {
		err_print_bw(err);
	}
}